

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

bool ON_ArcToArcTransitionIsNotGsmooth
               (ON_Arc *arc0,ON_Arc *arc1,double cos_angle_tolerance,double curvature_tolerance)

{
  undefined1 auVar1 [16];
  bool bVar2;
  byte bVar3;
  ON_3dPoint *pOVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  ON_3dVector V1;
  ON_2dVector D;
  ON_3dVector V0;
  ON_3dPoint local_70;
  ON_3dPoint local_58;
  ON_3dPoint local_40;
  
  bVar2 = ON_Arc::IsValid(arc0);
  if ((bVar2) && (bVar2 = ON_Arc::IsValid(arc1), bVar2)) {
    dVar5 = ON_Circle::Radius(&arc0->super_ON_Circle);
    dVar6 = ON_Circle::Radius(&arc1->super_ON_Circle);
    dVar8 = dVar6;
    if (dVar5 < dVar6) {
      dVar8 = dVar5;
    }
    bVar3 = 0;
    if (((dVar5 <= 0.0) || (dVar6 <= 0.0)) ||
       (dVar9 = (double)(~-(ulong)(dVar6 <= dVar5) & (ulong)dVar6 |
                        -(ulong)(dVar6 <= dVar5) & (ulong)dVar5), 1000000.0 <= dVar9))
    goto LAB_0058918a;
    dVar9 = dVar9 * 0.1;
    if ((dVar9 < ABS(dVar5 - dVar6)) &&
       (auVar12._8_8_ = dVar6, auVar12._0_8_ = dVar5, auVar12 = divpd(_DAT_006979d0,auVar12),
       curvature_tolerance < ABS(auVar12._0_8_ - auVar12._8_8_))) {
      ON_Arc::EndPoint(&local_40,arc0);
      ON_Arc::StartPoint(&local_70,arc1);
      dVar7 = ON_3dPoint::DistanceTo(&local_40,&local_70);
      bVar3 = 0;
      if ((2.3283064365386963e-10 < dVar7) || (dVar8 * 0.01 < dVar7)) goto LAB_0058918a;
      dVar8 = ON_3dVector::operator*
                        (&(arc0->super_ON_Circle).plane.zaxis,&(arc1->super_ON_Circle).plane.zaxis);
      if (((0.9986295347545738 <= dVar8) || (cos_angle_tolerance <= dVar8)) ||
         (dVar8 < 1.0000000149011612)) {
        ON_Arc::EndPoint(&local_70,arc0);
        pOVar4 = ON_Circle::Center(&arc0->super_ON_Circle);
        ON_3dPoint::operator-((ON_3dVector *)&local_40,&local_70,pOVar4);
        ON_Arc::StartPoint(&local_58,arc1);
        pOVar4 = ON_Circle::Center(&arc1->super_ON_Circle);
        ON_3dPoint::operator-((ON_3dVector *)&local_70,&local_58,pOVar4);
        ON_3dVector::Unitize((ON_3dVector *)&local_40);
        ON_3dVector::Unitize((ON_3dVector *)&local_70);
        dVar8 = ON_3dVector::operator*((ON_3dVector *)&local_40,(ON_3dVector *)&local_70);
        if (((0.9986295347545738 <= dVar8) || (cos_angle_tolerance <= dVar8)) ||
           (dVar8 < 1.0000000149011612)) {
          dVar8 = ON_Arc::AngleRadians(arc0);
          dVar7 = ON_Arc::AngleRadians(arc1);
          auVar1._8_8_ = ABS(dVar7);
          auVar1._0_8_ = ABS(dVar8);
          auVar12 = minpd(_DAT_006a8d10,auVar1);
          dVar8 = auVar12._0_8_;
          dVar10 = dVar5 * dVar8;
          dVar7 = auVar12._8_8_;
          dVar11 = dVar6 * dVar7;
          if (dVar10 <= dVar11) {
            if (dVar10 < dVar11) {
              dVar7 = dVar10 / dVar6;
            }
          }
          else {
            dVar8 = dVar11 / dVar5;
          }
          bVar3 = 0;
          if ((2.3283064365386963e-10 < dVar10) && (2.3283064365386963e-10 < dVar11)) {
            dVar10 = cos(dVar8);
            dVar11 = cos(dVar7);
            dVar8 = sin(dVar8);
            dVar7 = sin(dVar7);
            ON_2dVector::ON_2dVector
                      ((ON_2dVector *)&local_58,dVar11 * (dVar6 + -1.0) + dVar10 * (1.0 - dVar5),
                       dVar8 * dVar5 - dVar7 * dVar6);
            dVar8 = ON_2dVector::Length((ON_2dVector *)&local_58);
            bVar3 = -(2.3283064365386963e-10 < dVar8) & -(dVar9 < dVar8);
          }
          goto LAB_0058918a;
        }
      }
    }
  }
  bVar3 = 0;
LAB_0058918a:
  return (bool)(bVar3 & 1);
}

Assistant:

static bool ON_ArcToArcTransitionIsNotGsmooth(
  const ON_Arc& arc0,
  const ON_Arc& arc1,
  double cos_angle_tolerance,
  double curvature_tolerance
  )
{
  const double tolerance = ON_ZERO_TOLERANCE;
  if ( !arc0.IsValid() )
    return false;
  if ( !arc1.IsValid() )
    return false;

  const double r0 = arc0.Radius();
  const double r1 = arc1.Radius();
  const double maxr = (r0 >= r1) ? r0 : r1;
  const double minr = (r0 >= r1) ? r1 : r0;
  if ( !(r0 > 0.0 && r1 > 0.0 && maxr < 1.0e6) )
    return false;

  // Please discuss any changes to this 10% max radius
  // test with Dale Lear.
  // This function detects aesthetic changes - it is not
  // intended to be used for any other purpose.
  if ( !(fabs(r0-r1) > 0.1*maxr) )
    return false;

  if ( fabs(1.0/r0 - 1.0/r1) <= curvature_tolerance )
    return false;

  // The end of arc0 and the start of arc1 must be coincident.
  double d = arc0.EndPoint().DistanceTo(arc1.StartPoint());
  if ( !(d <= tolerance && d <= 0.01*minr) )
    return false;

  // arcs must be coplanar
  d = arc0.plane.zaxis*arc1.plane.zaxis;
  if ( !(d >= cos(3.0*ON_PI/180.0)) && !(d >= cos_angle_tolerance) && !(d < 1.0+ON_SQRT_EPSILON) )
  {
    // arcs are not coplanar
    return false;
  }

  // arcs must be tangent and have centers on the same side of the common point.
  ON_3dVector V0 = arc0.EndPoint() - arc0.Center();
  ON_3dVector V1 = arc1.StartPoint() - arc1.Center();
  V0.Unitize();
  V1.Unitize();
  d = V0*V1;
  if ( !(d >= cos(3.0*ON_PI/180.0)) && !(d >= cos_angle_tolerance) && !(d < 1.0+ON_SQRT_EPSILON) )
  {
    // arcs are not tangent or do not have their centers on
    // the same side of the common point.
    return false;
  }

  // If the arcs started at the same location,
  // they were tangent at the start, and they
  // were both the length of the shortest arc,
  // then we should be able to "see" the difference
  // in the end points.
  double a0 = fabs(arc0.AngleRadians());
  double a1 = fabs(arc1.AngleRadians());
  if (a0 > ON_PI)
    a0 = ON_PI;
  if (a1 > ON_PI)
    a1 = ON_PI;
  double l0 = r0*a0;
  double l1 = r1*a1;
  if ( l0 > l1 )
  {
    a0 = l1/r0;
  }
  else if ( l1 > l0 )
  {
    a1 = l0/r1;
  }
  if ( l0 > tolerance && l1 > tolerance )
  {
    ON_2dVector D((1.0-r0)*cos(a0) + (r1-1.0)*cos(a1),r0*sin(a0)-r1*sin(a1));
    d = D.Length();
    if ( d > tolerance && d > 0.1*maxr )
      return true; // "visibly" different
  }

  return false;
}